

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Literal * __thiscall
wasm::TranslateToFuzzReader::makeLiteral
          (Literal *__return_storage_ptr__,TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  double dVar1;
  int8_t iVar2;
  byte bVar3;
  int16_t iVar4;
  ushort uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  uint uVar8;
  ulong uVar9;
  Literal *this_01;
  long lVar10;
  float fVar11;
  Literal local_1f8;
  Literal local_1e0;
  undefined1 auStack_1c8 [8];
  Literal value;
  Literal local_198;
  Literal local_180;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  Literal local_a8;
  Literal local_90;
  Literal local_78;
  Literal local_60;
  Literal local_40;
  
  this_00 = &this->random;
  if (type.id == 6) {
    uVar6 = Random::upTo(this_00,6);
    switch(uVar6) {
    case 0:
      makeLiteral((Literal *)auStack_1c8,this,(Type)0x2);
      makeLiteral((Literal *)&value.type,this,(Type)0x2);
      makeLiteral(&local_198,this,(Type)0x2);
      makeLiteral(&local_180,this,(Type)0x2);
      makeLiteral(&local_168,this,(Type)0x2);
      makeLiteral(&local_150,this,(Type)0x2);
      makeLiteral(&local_138,this,(Type)0x2);
      makeLiteral(&local_120,this,(Type)0x2);
      makeLiteral(&local_108,this,(Type)0x2);
      makeLiteral(&local_f0,this,(Type)0x2);
      makeLiteral(&local_d8,this,(Type)0x2);
      makeLiteral(&local_c0,this,(Type)0x2);
      makeLiteral(&local_a8,this,(Type)0x2);
      makeLiteral(&local_90,this,(Type)0x2);
      makeLiteral(&local_78,this,(Type)0x2);
      makeLiteral(&local_60,this,(Type)0x2);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)auStack_1c8);
      lVar10 = 0x168;
      do {
        ::wasm::Literal::~Literal((Literal *)(auStack_1c8 + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != -0x18);
      return __return_storage_ptr__;
    case 1:
      makeLiteral((Literal *)auStack_1c8,this,(Type)0x2);
      makeLiteral((Literal *)&value.type,this,(Type)0x2);
      makeLiteral(&local_198,this,(Type)0x2);
      makeLiteral(&local_180,this,(Type)0x2);
      makeLiteral(&local_168,this,(Type)0x2);
      makeLiteral(&local_150,this,(Type)0x2);
      makeLiteral(&local_138,this,(Type)0x2);
      makeLiteral(&local_120,this,(Type)0x2);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)auStack_1c8);
      lVar10 = 0xa8;
      do {
        ::wasm::Literal::~Literal((Literal *)(auStack_1c8 + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != -0x18);
      return __return_storage_ptr__;
    case 2:
      makeLiteral((Literal *)auStack_1c8,this,(Type)0x2);
      makeLiteral((Literal *)&value.type,this,(Type)0x2);
      makeLiteral(&local_198,this,(Type)0x2);
      makeLiteral(&local_180,this,(Type)0x2);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)auStack_1c8);
      lVar10 = 0x48;
      break;
    case 3:
      makeLiteral((Literal *)auStack_1c8,this,(Type)0x3);
      makeLiteral((Literal *)&value.type,this,(Type)0x3);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)auStack_1c8);
      lVar10 = 0x18;
      do {
        ::wasm::Literal::~Literal((Literal *)(auStack_1c8 + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != -0x18);
      return __return_storage_ptr__;
    case 4:
      makeLiteral((Literal *)auStack_1c8,this,(Type)0x4);
      makeLiteral((Literal *)&value.type,this,(Type)0x4);
      makeLiteral(&local_198,this,(Type)0x4);
      makeLiteral(&local_180,this,(Type)0x4);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)auStack_1c8);
      lVar10 = 0x48;
      do {
        ::wasm::Literal::~Literal((Literal *)(auStack_1c8 + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != -0x18);
      return __return_storage_ptr__;
    case 5:
      makeLiteral((Literal *)auStack_1c8,this,(Type)0x5);
      makeLiteral((Literal *)&value.type,this,(Type)0x5);
      ::wasm::Literal::Literal(__return_storage_ptr__,(array *)auStack_1c8);
      lVar10 = 0x18;
      do {
        ::wasm::Literal::~Literal((Literal *)(auStack_1c8 + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != -0x18);
      return __return_storage_ptr__;
    default:
      ::wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xc60);
    }
    do {
      ::wasm::Literal::~Literal((Literal *)(auStack_1c8 + lVar10));
      lVar10 = lVar10 + -0x18;
    } while (lVar10 != -0x18);
    return __return_storage_ptr__;
  }
  uVar6 = Random::upTo(this_00,4);
  switch(uVar6) {
  case 0:
    if (6 < type.id) {
LAB_0014dda1:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    switch(type.id & 0xffffffff) {
    case 0:
    case 1:
    case 6:
      ::wasm::handle_unreachable
                ("invalid type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xc73);
    case 2:
      iVar7 = Random::get32(this_00);
      (__return_storage_ptr__->field_0).i32 = iVar7;
LAB_0014dc99:
      (__return_storage_ptr__->type).id = 2;
      return __return_storage_ptr__;
    case 3:
      uVar9 = Random::get64(this_00);
switchD_0014dc95_caseD_3:
      (__return_storage_ptr__->field_0).i64 = uVar9;
      (__return_storage_ptr__->type).id = 3;
      return __return_storage_ptr__;
    case 4:
      fVar11 = Random::getFloat(this_00);
LAB_0014dcd1:
      (__return_storage_ptr__->field_0).i32 = (int32_t)fVar11;
      (__return_storage_ptr__->type).id = 4;
      return __return_storage_ptr__;
    case 5:
      dVar1 = Random::getDouble(this_00);
LAB_0014dcbb:
      (__return_storage_ptr__->field_0).i64 = (int64_t)dVar1;
      (__return_storage_ptr__->type).id = 5;
      return __return_storage_ptr__;
    }
    break;
  case 1:
    uVar6 = Random::upTo(this_00,6);
    switch(uVar6) {
    case 0:
      iVar2 = Random::get(this_00);
      uVar9 = (ulong)iVar2;
      break;
    case 1:
      bVar3 = Random::get(this_00);
      uVar9 = (ulong)bVar3;
      break;
    case 2:
      iVar4 = Random::get16(this_00);
      uVar9 = (ulong)iVar4;
      break;
    case 3:
      uVar5 = Random::get16(this_00);
      uVar9 = (ulong)uVar5;
      break;
    case 4:
      iVar7 = Random::get32(this_00);
      uVar9 = (ulong)iVar7;
      break;
    case 5:
      uVar8 = Random::get32(this_00);
      uVar9 = (ulong)uVar8;
      break;
    default:
      ::wasm::handle_unreachable
                ("invalid value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xc8e);
    }
    if (6 < type.id) goto LAB_0014dda1;
    switch(type.id & 0xffffffff) {
    case 0:
    case 1:
    case 6:
      ::wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xc9c);
    case 2:
      (__return_storage_ptr__->field_0).i32 = (int32_t)uVar9;
      goto LAB_0014dc99;
    case 3:
      goto switchD_0014dc95_caseD_3;
    case 4:
      fVar11 = (float)(long)uVar9;
      goto LAB_0014dcd1;
    case 5:
      dVar1 = (double)(long)uVar9;
      goto LAB_0014dcbb;
    }
    break;
  case 2:
    auStack_1c8 = (undefined1  [8])0x0;
    value.field_0.i64 = 0;
    value.field_0.func.super_IString.str._M_str = (char *)0x0;
    if (6 < type.id) goto LAB_0014dda1;
    switch(type.id & 0xffffffff) {
    case 0:
    case 1:
    case 6:
      ::wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xcdc);
    case 2:
      uVar6 = Random::upTo(this_00,10);
      if (uVar6 < 5) {
        local_40.field_0.i32 = *(undefined4 *)(&DAT_001d3d98 + (ulong)uVar6 * 4);
      }
      else {
        local_40.field_0.i32 =
             Random::pickGivenNum<int,int,unsigned_char,unsigned_short,unsigned_int>
                       (this_00,(ulong)uVar6 - 5,-0x80000000,0x7fffffff,0xff,0xffff,0xffffffff);
      }
      local_40.type.id = 2;
      ::wasm::Literal::operator=((Literal *)auStack_1c8,&local_40);
      break;
    case 3:
      local_40.field_0.i64 =
           Random::
           pick<long,signed_char,signed_char,short,short,int,int,long,long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
                     (this_00,0,-0x80,'\x7f',-0x8000,0x7fff,-0x80000000,0x7fffffff,
                      -0x8000000000000000,0x7fffffffffffffff,0xff,0xffff,0xffffffff,
                      0xffffffffffffffff);
      local_40.type.id = 3;
      ::wasm::Literal::operator=((Literal *)auStack_1c8,&local_40);
      break;
    case 4:
      fVar11 = Random::pick<float,float,float,float,int,int,long,long,unsigned_int,unsigned_long>
                         (this_00,0.0,-0.0,1.1754944e-38,3.4028235e+38,-0x80000000,0x7fffffff,
                          -0x8000000000000000,0x7fffffffffffffff,0xffffffff,0xffffffffffffffff);
      local_40.field_0.i32 = (int32_t)fVar11;
      local_40.type.id = 4;
      ::wasm::Literal::operator=((Literal *)auStack_1c8,&local_40);
      break;
    case 5:
      local_40.field_0.i64 =
           (int64_t)Random::
                    pick<double,double,float,float,double,double,int,int,long,long,unsigned_int,unsigned_long>
                              (this_00,0.0,-0.0,1.1754944e-38,3.4028235e+38,2.2250738585072014e-308,
                               1.79769313486232e+308,-0x80000000,0x7fffffff,-0x8000000000000000,
                               0x7fffffffffffffff,0xffffffff,0xffffffffffffffff);
      local_40.type.id = 5;
      ::wasm::Literal::operator=((Literal *)auStack_1c8,&local_40);
      break;
    default:
      goto switchD_0014d602_default;
    }
    ::wasm::Literal::~Literal(&local_40);
switchD_0014d602_default:
    ::wasm::Literal::Literal(&local_1f8,(Literal *)auStack_1c8);
    tweak(__return_storage_ptr__,this,&local_1f8);
    this_01 = &local_1f8;
LAB_0014dd5f:
    ::wasm::Literal::~Literal(this_01);
    ::wasm::Literal::~Literal((Literal *)auStack_1c8);
    return __return_storage_ptr__;
  case 3:
    auStack_1c8 = (undefined1  [8])0x0;
    value.field_0.i64 = 0;
    value.field_0.func.super_IString.str._M_str = (char *)0x0;
    if (6 < type.id) goto LAB_0014dda1;
    switch(type.id & 0xffffffff) {
    case 0:
    case 1:
    case 6:
      ::wasm::handle_unreachable
                ("unexpected type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0xcf3);
    case 2:
      uVar6 = Random::upTo(this_00,0x20);
      local_40.field_0.i32 = 1 << ((byte)uVar6 & 0x1f);
      local_40.type.id = 2;
      ::wasm::Literal::operator=((Literal *)auStack_1c8,&local_40);
      break;
    case 3:
      uVar6 = Random::upTo(this_00,0x40);
      local_40.field_0.func.super_IString.str._M_len = 1L << ((byte)uVar6 & 0x3f);
      local_40.type.id = 3;
      ::wasm::Literal::operator=((Literal *)auStack_1c8,&local_40);
      break;
    case 4:
      uVar6 = Random::upTo(this_00,0x40);
      local_40.field_0.i32 = (int32_t)(float)(1L << ((byte)uVar6 & 0x3f));
      local_40.type.id = 4;
      ::wasm::Literal::operator=((Literal *)auStack_1c8,&local_40);
      break;
    case 5:
      uVar6 = Random::upTo(this_00,0x40);
      local_40.field_0.i64 = (int64_t)(double)(1L << ((byte)uVar6 & 0x3f));
      local_40.type.id = 5;
      ::wasm::Literal::operator=((Literal *)auStack_1c8,&local_40);
      break;
    default:
      goto switchD_0014d667_default;
    }
    ::wasm::Literal::~Literal(&local_40);
switchD_0014d667_default:
    ::wasm::Literal::Literal(&local_1e0,(Literal *)auStack_1c8);
    tweak(__return_storage_ptr__,this,&local_1e0);
    this_01 = &local_1e0;
    goto LAB_0014dd5f;
  }
  ::wasm::handle_unreachable
            ("invalid value",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
             ,0xcf8);
}

Assistant:

Literal TranslateToFuzzReader::makeLiteral(Type type) {
  if (type == Type::v128) {
    // generate each lane individually for random lane interpretation
    switch (upTo(6)) {
      case 0:
        return Literal(std::array<Literal, 16>{{makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32),
                                                makeLiteral(Type::i32)}});
      case 1:
        return Literal(std::array<Literal, 8>{{makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32)}});
      case 2:
        return Literal(std::array<Literal, 4>{{makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32),
                                               makeLiteral(Type::i32)}});
      case 3:
        return Literal(std::array<Literal, 2>{
          {makeLiteral(Type::i64), makeLiteral(Type::i64)}});
      case 4:
        return Literal(std::array<Literal, 4>{{makeLiteral(Type::f32),
                                               makeLiteral(Type::f32),
                                               makeLiteral(Type::f32),
                                               makeLiteral(Type::f32)}});
      case 5:
        return Literal(std::array<Literal, 2>{
          {makeLiteral(Type::f64), makeLiteral(Type::f64)}});
      default:
        WASM_UNREACHABLE("unexpected value");
    }
  }

  switch (upTo(4)) {
    case 0: {
      // totally random, entire range
      switch (type.getBasic()) {
        case Type::i32:
          return Literal(get32());
        case Type::i64:
          return Literal(get64());
        case Type::f32:
          return Literal(getFloat());
        case Type::f64:
          return Literal(getDouble());
        case Type::v128:
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("invalid type");
      }
      break;
    }
    case 1: {
      // small range
      int64_t small;
      switch (upTo(6)) {
        case 0:
          small = int8_t(get());
          break;
        case 1:
          small = uint8_t(get());
          break;
        case 2:
          small = int16_t(get16());
          break;
        case 3:
          small = uint16_t(get16());
          break;
        case 4:
          small = int32_t(get32());
          break;
        case 5:
          small = uint32_t(get32());
          break;
        default:
          WASM_UNREACHABLE("invalid value");
      }
      switch (type.getBasic()) {
        case Type::i32:
          return Literal(int32_t(small));
        case Type::i64:
          return Literal(int64_t(small));
        case Type::f32:
          return Literal(float(small));
        case Type::f64:
          return Literal(double(small));
        case Type::v128:
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      break;
    }
    case 2: {
      // special values
      Literal value;
      switch (type.getBasic()) {
        case Type::i32:
          value = Literal(pick<int32_t>(0,
                                        std::numeric_limits<int8_t>::min(),
                                        std::numeric_limits<int8_t>::max(),
                                        std::numeric_limits<int16_t>::min(),
                                        std::numeric_limits<int16_t>::max(),
                                        std::numeric_limits<int32_t>::min(),
                                        std::numeric_limits<int32_t>::max(),
                                        std::numeric_limits<uint8_t>::max(),
                                        std::numeric_limits<uint16_t>::max(),
                                        std::numeric_limits<uint32_t>::max()));
          break;
        case Type::i64:
          value = Literal(pick<int64_t>(0,
                                        std::numeric_limits<int8_t>::min(),
                                        std::numeric_limits<int8_t>::max(),
                                        std::numeric_limits<int16_t>::min(),
                                        std::numeric_limits<int16_t>::max(),
                                        std::numeric_limits<int32_t>::min(),
                                        std::numeric_limits<int32_t>::max(),
                                        std::numeric_limits<int64_t>::min(),
                                        std::numeric_limits<int64_t>::max(),
                                        std::numeric_limits<uint8_t>::max(),
                                        std::numeric_limits<uint16_t>::max(),
                                        std::numeric_limits<uint32_t>::max(),
                                        std::numeric_limits<uint64_t>::max()));
          break;
        case Type::f32:
          value = Literal(pick<float>(0.0f,
                                      -0.0f,
                                      std::numeric_limits<float>::min(),
                                      std::numeric_limits<float>::max(),
                                      std::numeric_limits<int32_t>::min(),
                                      std::numeric_limits<int32_t>::max(),
                                      std::numeric_limits<int64_t>::min(),
                                      std::numeric_limits<int64_t>::max(),
                                      std::numeric_limits<uint32_t>::max(),
                                      std::numeric_limits<uint64_t>::max()));
          break;
        case Type::f64:
          value = Literal(pick<double>(0.0,
                                       -0.0,
                                       std::numeric_limits<float>::min(),
                                       std::numeric_limits<float>::max(),
                                       std::numeric_limits<double>::min(),
                                       std::numeric_limits<double>::max(),
                                       std::numeric_limits<int32_t>::min(),
                                       std::numeric_limits<int32_t>::max(),
                                       std::numeric_limits<int64_t>::min(),
                                       std::numeric_limits<int64_t>::max(),
                                       std::numeric_limits<uint32_t>::max(),
                                       std::numeric_limits<uint64_t>::max()));
          break;
        case Type::v128:
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      return tweak(value);
    }
    case 3: {
      // powers of 2
      Literal value;
      switch (type.getBasic()) {
        case Type::i32:
          value = Literal(int32_t(1) << upTo(32));
          break;
        case Type::i64:
          value = Literal(int64_t(1) << upTo(64));
          break;
        case Type::f32:
          value = Literal(float(int64_t(1) << upTo(64)));
          break;
        case Type::f64:
          value = Literal(double(int64_t(1) << upTo(64)));
          break;
        case Type::v128:
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
      return tweak(value);
    }
  }
  WASM_UNREACHABLE("invalid value");
}